

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O3

bool __thiscall
google::protobuf::io::CopyingOutputStreamAdaptor::WriteBuffer(CopyingOutputStreamAdaptor *this)

{
  uchar *puVar1;
  int iVar2;
  
  if (this->failed_ == false) {
    if (this->buffer_used_ == 0) {
      return true;
    }
    iVar2 = (*this->copying_stream_->_vptr_CopyingOutputStream[2])
                      (this->copying_stream_,(this->buffer_).array_);
    if ((char)iVar2 != '\0') {
      this->position_ = this->position_ + (long)this->buffer_used_;
      this->buffer_used_ = 0;
      return true;
    }
    this->failed_ = true;
    this->buffer_used_ = 0;
    puVar1 = (this->buffer_).array_;
    if (puVar1 != (uchar *)0x0) {
      operator_delete__(puVar1);
      (this->buffer_).array_ = (uchar *)0x0;
    }
  }
  return false;
}

Assistant:

bool CopyingOutputStreamAdaptor::WriteBuffer() {
  if (failed_) {
    // Already failed on a previous write.
    return false;
  }

  if (buffer_used_ == 0) return true;

  if (copying_stream_->Write(buffer_.get(), buffer_used_)) {
    position_ += buffer_used_;
    buffer_used_ = 0;
    return true;
  } else {
    failed_ = true;
    FreeBuffer();
    return false;
  }
}